

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O3

void __thiscall Atari2600::TIA::set_colour_palette_entry(TIA *this,size_t index,uint8_t colour)

{
  byte bVar1;
  
  if (this->tv_standard_ == NTSC) {
    bVar1 = 0xff;
    if (colour < 0x10) goto LAB_002f9c70;
    bVar1 = 0x1a - (char)((uint)(colour >> 4) * 0x9c54e >> 0x10);
  }
  else {
    bVar1 = 0xff;
    if ((byte)(colour + 0x20) < 0x40) goto LAB_002f9c70;
    bVar1 = colour >> 4 & 1;
    bVar1 = (byte)((uint)((-bVar1 ^ colour >> 5) + bVar1 + 6 & 0xf) * 0xa95aa >> 0x10);
  }
  bVar1 = bVar1 & 0x7f;
LAB_002f9c70:
  (this->colour_palette_)._M_elems[index].original = colour;
  *(char *)&(this->colour_palette_)._M_elems[index].luminance_phase =
       (char)((uint)(colour & 0xe) * 0x1237b6 >> 0x10);
  *(byte *)((long)&(this->colour_palette_)._M_elems[index].luminance_phase + 1) = bVar1;
  return;
}

Assistant:

void TIA::set_colour_palette_entry(size_t index, uint8_t colour) {
	const uint8_t luminance = ((colour & 14) * 255) / 14;

	uint8_t phase = colour >> 4;

	if(tv_standard_ == OutputMode::NTSC) {
		if(!phase) phase = 255;
		else {
			phase = -(phase * 127) / 13;
			phase -= 102;
			phase &= 127;
		}
	} else {
		if(phase < 2 || phase > 13) {
			phase = 255;
		} else {
			const auto direction = phase & 1;

			phase >>= 1;
			if(direction) phase ^= 0xf;
			phase = (phase + 6 + direction) & 0xf;

			phase = (phase * 127) / 12;
			phase &= 127;
		}
	}

	colour_palette_[index].original = colour;
	uint8_t *target = reinterpret_cast<uint8_t *>(&colour_palette_[index].luminance_phase);
	target[0] = luminance;
	target[1] = phase;
}